

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O2

void cht_Take(player_t *player,char *name,int amount)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  PClassActor *pPVar6;
  AInventory *pAVar7;
  uint i_1;
  uint i;
  ulong uVar8;
  
  pAVar1 = player->mo;
  if (pAVar1 == (APlayerPawn *)0x0) {
    return;
  }
  iVar5 = player->health;
  if (iVar5 < 1) {
    return;
  }
  iVar3 = strcasecmp(name,"all");
  if (iVar3 == 0) {
LAB_003b6ae0:
    for (uVar8 = 0; uVar8 < PClassActor::AllActorClasses.Count; uVar8 = uVar8 + 1) {
      pPVar6 = PClassActor::AllActorClasses.Array[uVar8];
      bVar2 = PClass::IsAncestorOf(ABackpackItem::RegistrationInfo.MyClass,&pPVar6->super_PClass);
      if ((bVar2) &&
         (pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
         pAVar7 != (AInventory *)0x0)) {
        (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
      }
    }
    if (iVar3 != 0) {
      return;
    }
LAB_003b6b3b:
    for (uVar8 = 0; uVar8 < PClassActor::AllActorClasses.Count; uVar8 = uVar8 + 1) {
      if (((PClassActor::AllActorClasses.Array[uVar8]->super_PClass).ParentClass ==
           AAmmo::RegistrationInfo.MyClass) &&
         (pAVar7 = AActor::FindInventory
                             (&player->mo->super_AActor,PClassActor::AllActorClasses.Array[uVar8],
                              false), pAVar7 != (AInventory *)0x0)) {
        (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar7);
      }
    }
    if (iVar3 != 0) {
      return;
    }
LAB_003b6b91:
    for (uVar8 = 0; uVar8 < PClassActor::AllActorClasses.Count; uVar8 = uVar8 + 1) {
      pPVar6 = PClassActor::AllActorClasses.Array[uVar8];
      bVar2 = PClass::IsAncestorOf(AArmor::RegistrationInfo.MyClass,&pPVar6->super_PClass);
      if ((bVar2) &&
         (pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
         pAVar7 != (AInventory *)0x0)) {
        (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar7);
      }
    }
    if (iVar3 != 0) {
      return;
    }
LAB_003b6c50:
    for (uVar8 = 0; uVar8 < PClassActor::AllActorClasses.Count; uVar8 = uVar8 + 1) {
      pPVar6 = PClassActor::AllActorClasses.Array[uVar8];
      bVar2 = PClass::IsAncestorOf(AKey::RegistrationInfo.MyClass,&pPVar6->super_PClass);
      if ((bVar2) &&
         (pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
         pAVar7 != (AInventory *)0x0)) {
        (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
      }
    }
    if (iVar3 != 0) {
      return;
    }
LAB_003b6cab:
    for (uVar8 = 0; uVar8 < PClassActor::AllActorClasses.Count; uVar8 = uVar8 + 1) {
      pPVar6 = PClassActor::AllActorClasses.Array[uVar8];
      if ((pPVar6 != (PClassActor *)AWeapon::RegistrationInfo.MyClass) &&
         (bVar2 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,&pPVar6->super_PClass),
         bVar2)) {
        pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false);
        if (pAVar7 != (AInventory *)0x0) {
          (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
        }
        player->ReadyWeapon = (AWeapon *)0x0;
        player->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
      }
    }
    if (iVar3 != 0) {
      return;
    }
  }
  else {
    iVar4 = strcasecmp(name,"health");
    if (iVar4 == 0) {
      iVar3 = (pAVar1->super_AActor).health;
      iVar4 = iVar3 - amount;
      if ((iVar4 != 0 && amount <= iVar3) && (amount != 0 && amount < iVar5)) {
        if (amount < 1) {
          return;
        }
        (pAVar1->super_AActor).health = iVar4;
        player->health = iVar4;
        return;
      }
      cht_Suicide(player);
      if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
        return;
      }
      C_HideConsole();
      return;
    }
    iVar5 = strcasecmp(name,"backpack");
    if (iVar5 == 0) goto LAB_003b6ae0;
    iVar5 = strcasecmp(name,"ammo");
    if (iVar5 == 0) goto LAB_003b6b3b;
    iVar5 = strcasecmp(name,"armor");
    if (iVar5 == 0) goto LAB_003b6b91;
    iVar5 = strcasecmp(name,"keys");
    if (iVar5 == 0) goto LAB_003b6c50;
    iVar5 = strcasecmp(name,"weapons");
    if (iVar5 == 0) goto LAB_003b6cab;
    iVar5 = strcasecmp(name,"artifacts");
    if (iVar5 != 0) {
      iVar5 = strcasecmp(name,"puzzlepieces");
      if (iVar5 != 0) {
        pPVar6 = PClass::FindActor(name);
        if ((pPVar6 != (PClassActor *)0x0) &&
           (bVar2 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&pPVar6->super_PClass)
           , bVar2)) {
          (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x16])
                    (player->mo,pPVar6,(ulong)(amount + (uint)(amount == 0)),0,0);
          return;
        }
        if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
          return;
        }
        Printf("Unknown item \"%s\"\n",name);
        return;
      }
      goto LAB_003b6e0a;
    }
  }
  for (uVar8 = 0; uVar8 < PClassActor::AllActorClasses.Count; uVar8 = uVar8 + 1) {
    pPVar6 = PClassActor::AllActorClasses.Array[uVar8];
    bVar2 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&pPVar6->super_PClass);
    if (((((bVar2) &&
          (bVar2 = PClass::IsAncestorOf(APuzzleItem::RegistrationInfo.MyClass,&pPVar6->super_PClass)
          , !bVar2)) &&
         (bVar2 = PClass::IsAncestorOf(APowerup::RegistrationInfo.MyClass,&pPVar6->super_PClass),
         !bVar2)) &&
        ((bVar2 = PClass::IsAncestorOf(AArmor::RegistrationInfo.MyClass,&pPVar6->super_PClass),
         !bVar2 && (bVar2 = PClass::IsAncestorOf
                                      (AWeapon::RegistrationInfo.MyClass,&pPVar6->super_PClass),
                   !bVar2)))) &&
       ((bVar2 = PClass::IsAncestorOf(AKey::RegistrationInfo.MyClass,&pPVar6->super_PClass), !bVar2
        && (pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
           pAVar7 != (AInventory *)0x0)))) {
      (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
    }
  }
  if (iVar3 != 0) {
    return;
  }
LAB_003b6e0a:
  for (uVar8 = 0; uVar8 < PClassActor::AllActorClasses.Count; uVar8 = uVar8 + 1) {
    pPVar6 = PClassActor::AllActorClasses.Array[uVar8];
    bVar2 = PClass::IsAncestorOf(APuzzleItem::RegistrationInfo.MyClass,&pPVar6->super_PClass);
    if ((bVar2) &&
       (pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
       pAVar7 != (AInventory *)0x0)) {
      (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
    }
  }
  return;
}

Assistant:

void cht_Take (player_t *player, const char *name, int amount)
{
	bool takeall;
	PClassActor *type;

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	takeall = (stricmp (name, "all") == 0);

	if (!takeall && stricmp (name, "health") == 0)
	{
		if (player->mo->health - amount <= 0
			|| player->health - amount <= 0
			|| amount == 0)
		{

			cht_Suicide (player);

			if (player == &players[consoleplayer])
				C_HideConsole ();

			return;
		}

		if (amount > 0)
		{
			if (player->mo)
			{
				player->mo->health -= amount;
	  			player->health = player->mo->health;
			}
			else
			{
				player->health -= amount;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "backpack") == 0)
	{
		// Take away all types of backpacks the player might own.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf(RUNTIME_CLASS (ABackpackItem)))
			{
				AInventory *pack = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (pack)
					pack->Destroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "ammo") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS (AAmmo))
			{
				AInventory *ammo = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (ammo)
					ammo->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "armor") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AArmor)))
			{
				AInventory *armor = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (armor)
					armor->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AKey)))
			{
				AActor *key = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (key)
					key->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "weapons") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS (AWeapon)))
			{
				AActor *weapon = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (weapon)
					weapon->Destroy ();

				player->ReadyWeapon = nullptr;
				player->PendingWeapon = WP_NOCHANGE;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
			{
				if (!type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AArmor)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AWeapon)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AKey)))
				{
					AActor *artifact = player->mo->FindInventory(static_cast<PClassActor *>(type));

					if (artifact)
						artifact->Destroy ();
				}
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)))
			{
				AActor *puzzlepiece = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (puzzlepiece)
					puzzlepiece->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall)
		return;

	type = PClass::FindActor (name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->TakeInventory(type, amount ? amount : 1);
	}
	return;
}